

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

ssize_t __thiscall
duckdb_parquet::ColumnIndex::write(ColumnIndex *this,int __fd,void *__buf,size_t __n)

{
  _ColumnIndex__isset _Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  pointer pbVar9;
  pointer plVar10;
  uint uVar11;
  ulong uVar12;
  ulong *puVar13;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementOutputRecursionDepth(this_00);
  iVar2 = (*this_00->_vptr_TProtocol[4])(this_00,"ColumnIndex");
  iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"null_pages",0xf,1);
  iVar4 = (*this_00->_vptr_TProtocol[0xb])
                    (this_00,2,
                     (ulong)((*(int *)&(this->null_pages).super_vector<bool,_std::allocator<bool>_>.
                                       super__Bvector_base<std::allocator<bool>_>._M_impl.
                                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base.
                                       _M_p -
                             *(int *)&(this->null_pages).super_vector<bool,_std::allocator<bool>_>.
                                      super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                      _M_p) * 8 +
                            (this->null_pages).super_vector<bool,_std::allocator<bool>_>.
                            super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset));
  iVar4 = iVar3 + iVar2 + iVar4;
  puVar13 = (this->null_pages).super_vector<bool,_std::allocator<bool>_>.
            super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
            super__Bit_iterator_base._M_p;
  uVar12 = 0;
  while ((uVar11 = (uint)uVar12,
         puVar13 !=
         (this->null_pages).super_vector<bool,_std::allocator<bool>_>.
         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
         super__Bit_iterator_base._M_p ||
         (uVar11 != (this->null_pages).super_vector<bool,_std::allocator<bool>_>.
                    super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                    _M_finish.super__Bit_iterator_base._M_offset))) {
    iVar2 = (*this_00->_vptr_TProtocol[0xf])
                      (this_00,(ulong)((*puVar13 >> (uVar12 & 0x3f) & 1) != 0));
    iVar4 = iVar4 + iVar2;
    uVar8 = uVar11 + 1;
    puVar13 = puVar13 + (uVar11 == 0x3f);
    if (uVar11 == 0x3f) {
      uVar8 = 0;
    }
    uVar12 = (ulong)uVar8;
  }
  iVar2 = (*this_00->_vptr_TProtocol[0xc])(this_00);
  iVar3 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar5 = (*this_00->_vptr_TProtocol[6])(this_00,"min_values",0xf,2);
  iVar6 = (*this_00->_vptr_TProtocol[0xb])
                    (this_00,0xb,
                     (ulong)((long)(this->min_values).
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->min_values).
                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 5);
  iVar6 = iVar3 + iVar5 + iVar2 + iVar4 + iVar6;
  for (pbVar9 = (this->min_values).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar9 != (this->min_values).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
    iVar2 = (*this_00->_vptr_TProtocol[0x16])(this_00,pbVar9);
    iVar6 = iVar6 + iVar2;
  }
  iVar2 = (*this_00->_vptr_TProtocol[0xc])(this_00);
  iVar3 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar4 = (*this_00->_vptr_TProtocol[6])(this_00,"max_values",0xf,3);
  iVar5 = (*this_00->_vptr_TProtocol[0xb])
                    (this_00,0xb,
                     (ulong)((long)(this->max_values).
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->max_values).
                                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 5);
  iVar5 = iVar3 + iVar4 + iVar2 + iVar6 + iVar5;
  for (pbVar9 = (this->max_values).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar9 != (this->max_values).
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar9 = pbVar9 + 1) {
    iVar2 = (*this_00->_vptr_TProtocol[0x16])(this_00,pbVar9);
    iVar5 = iVar5 + iVar2;
  }
  iVar2 = (*this_00->_vptr_TProtocol[0xc])(this_00);
  iVar3 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar4 = (*this_00->_vptr_TProtocol[6])(this_00,"boundary_order",8,4);
  iVar6 = (*this_00->_vptr_TProtocol[0x12])(this_00,(ulong)this->boundary_order);
  iVar7 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar2 = iVar6 + iVar7 + iVar3 + iVar4 + iVar2 + iVar5;
  _Var1 = this->__isset;
  if (((byte)_Var1 & 1) != 0) {
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"null_counts",0xf,5);
    iVar4 = (*this_00->_vptr_TProtocol[0xb])
                      (this_00,10,
                       (ulong)((long)(this->null_counts).super_vector<long,_std::allocator<long>_>.
                                     super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(this->null_counts).super_vector<long,_std::allocator<long>_>.
                                    super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3);
    iVar4 = iVar3 + iVar2 + iVar4;
    for (plVar10 = (this->null_counts).super_vector<long,_std::allocator<long>_>.
                   super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                   _M_start;
        plVar10 !=
        (this->null_counts).super_vector<long,_std::allocator<long>_>.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
        plVar10 = plVar10 + 1) {
      iVar2 = (*this_00->_vptr_TProtocol[0x13])(this_00,*plVar10);
      iVar4 = iVar4 + iVar2;
    }
    iVar3 = (*this_00->_vptr_TProtocol[0xc])(this_00);
    iVar2 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = iVar3 + iVar4 + iVar2;
    _Var1 = this->__isset;
  }
  if (((byte)_Var1 & 2) != 0) {
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"repetition_level_histograms",0xf,6);
    iVar4 = (*this_00->_vptr_TProtocol[0xb])
                      (this_00,10,
                       (ulong)((long)(this->repetition_level_histograms).
                                     super_vector<long,_std::allocator<long>_>.
                                     super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(this->repetition_level_histograms).
                                    super_vector<long,_std::allocator<long>_>.
                                    super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3);
    iVar4 = iVar3 + iVar2 + iVar4;
    for (plVar10 = (this->repetition_level_histograms).super_vector<long,_std::allocator<long>_>.
                   super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                   _M_start;
        plVar10 !=
        (this->repetition_level_histograms).super_vector<long,_std::allocator<long>_>.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
        plVar10 = plVar10 + 1) {
      iVar2 = (*this_00->_vptr_TProtocol[0x13])(this_00,*plVar10);
      iVar4 = iVar4 + iVar2;
    }
    iVar3 = (*this_00->_vptr_TProtocol[0xc])(this_00);
    iVar2 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = iVar3 + iVar4 + iVar2;
    _Var1 = this->__isset;
  }
  if (((byte)_Var1 & 4) != 0) {
    iVar3 = (*this_00->_vptr_TProtocol[6])(this_00,"definition_level_histograms",0xf,7);
    iVar4 = (*this_00->_vptr_TProtocol[0xb])
                      (this_00,10,
                       (ulong)((long)(this->definition_level_histograms).
                                     super_vector<long,_std::allocator<long>_>.
                                     super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(this->definition_level_histograms).
                                    super_vector<long,_std::allocator<long>_>.
                                    super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3);
    iVar4 = iVar3 + iVar2 + iVar4;
    for (plVar10 = (this->definition_level_histograms).super_vector<long,_std::allocator<long>_>.
                   super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                   _M_start;
        plVar10 !=
        (this->definition_level_histograms).super_vector<long,_std::allocator<long>_>.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
        plVar10 = plVar10 + 1) {
      iVar2 = (*this_00->_vptr_TProtocol[0x13])(this_00,*plVar10);
      iVar4 = iVar4 + iVar2;
    }
    iVar3 = (*this_00->_vptr_TProtocol[0xc])(this_00);
    iVar2 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar2 = iVar3 + iVar4 + iVar2;
  }
  iVar3 = (*this_00->_vptr_TProtocol[8])(this_00);
  iVar4 = (*this_00->_vptr_TProtocol[5])(this_00);
  this_00->output_recursion_depth_ = this_00->output_recursion_depth_ - 1;
  return (ulong)(uint)(iVar3 + iVar2 + iVar4);
}

Assistant:

uint32_t ColumnIndex::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("ColumnIndex");

  xfer += oprot->writeFieldBegin("null_pages", ::apache::thrift::protocol::T_LIST, 1);
  {
    xfer += oprot->writeListBegin(::apache::thrift::protocol::T_BOOL, static_cast<uint32_t>(this->null_pages.size()));
    duckdb::vector<bool> ::const_iterator _iter205;
    for (_iter205 = this->null_pages.begin(); _iter205 != this->null_pages.end(); ++_iter205)
    {
      xfer += oprot->writeBool((*_iter205));
    }
    xfer += oprot->writeListEnd();
  }
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("min_values", ::apache::thrift::protocol::T_LIST, 2);
  {
    xfer += oprot->writeListBegin(::apache::thrift::protocol::T_STRING, static_cast<uint32_t>(this->min_values.size()));
    duckdb::vector<std::string> ::const_iterator _iter206;
    for (_iter206 = this->min_values.begin(); _iter206 != this->min_values.end(); ++_iter206)
    {
      xfer += oprot->writeBinary((*_iter206));
    }
    xfer += oprot->writeListEnd();
  }
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("max_values", ::apache::thrift::protocol::T_LIST, 3);
  {
    xfer += oprot->writeListBegin(::apache::thrift::protocol::T_STRING, static_cast<uint32_t>(this->max_values.size()));
    duckdb::vector<std::string> ::const_iterator _iter207;
    for (_iter207 = this->max_values.begin(); _iter207 != this->max_values.end(); ++_iter207)
    {
      xfer += oprot->writeBinary((*_iter207));
    }
    xfer += oprot->writeListEnd();
  }
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("boundary_order", ::apache::thrift::protocol::T_I32, 4);
  xfer += oprot->writeI32(static_cast<int32_t>(this->boundary_order));
  xfer += oprot->writeFieldEnd();

  if (this->__isset.null_counts) {
    xfer += oprot->writeFieldBegin("null_counts", ::apache::thrift::protocol::T_LIST, 5);
    {
      xfer += oprot->writeListBegin(::apache::thrift::protocol::T_I64, static_cast<uint32_t>(this->null_counts.size()));
      duckdb::vector<int64_t> ::const_iterator _iter208;
      for (_iter208 = this->null_counts.begin(); _iter208 != this->null_counts.end(); ++_iter208)
      {
        xfer += oprot->writeI64((*_iter208));
      }
      xfer += oprot->writeListEnd();
    }
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.repetition_level_histograms) {
    xfer += oprot->writeFieldBegin("repetition_level_histograms", ::apache::thrift::protocol::T_LIST, 6);
    {
      xfer += oprot->writeListBegin(::apache::thrift::protocol::T_I64, static_cast<uint32_t>(this->repetition_level_histograms.size()));
      duckdb::vector<int64_t> ::const_iterator _iter209;
      for (_iter209 = this->repetition_level_histograms.begin(); _iter209 != this->repetition_level_histograms.end(); ++_iter209)
      {
        xfer += oprot->writeI64((*_iter209));
      }
      xfer += oprot->writeListEnd();
    }
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.definition_level_histograms) {
    xfer += oprot->writeFieldBegin("definition_level_histograms", ::apache::thrift::protocol::T_LIST, 7);
    {
      xfer += oprot->writeListBegin(::apache::thrift::protocol::T_I64, static_cast<uint32_t>(this->definition_level_histograms.size()));
      duckdb::vector<int64_t> ::const_iterator _iter210;
      for (_iter210 = this->definition_level_histograms.begin(); _iter210 != this->definition_level_histograms.end(); ++_iter210)
      {
        xfer += oprot->writeI64((*_iter210));
      }
      xfer += oprot->writeListEnd();
    }
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}